

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

timestamp_t __thiscall NeuralConsumer::getData(NeuralConsumer *this,int16_t *dest)

{
  pointer psVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  timestamp_t tVar9;
  
  psVar1 = (this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*(this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub[5])
            (this,psVar1,
             (long)(this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)psVar1);
  puVar8 = (uint *)(this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_start;
  piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar2) {
    uVar6 = 0;
    uVar7 = 2;
    iVar5 = 0;
    do {
      if ((long)piVar2[uVar7 - 1] == 0) {
        iVar4 = 0;
      }
      else {
        memmove(dest + iVar5,(void *)((long)puVar8 + (long)piVar2[uVar6] * 2 + 4),
                (long)piVar2[uVar7 - 1] * 2);
        piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar4 = piVar2[uVar7 - 1];
      }
      iVar5 = iVar5 + iVar4;
      uVar6 = (ulong)uVar7;
      uVar7 = uVar7 + 2;
    } while (uVar6 < (ulong)((long)piVar3 - (long)piVar2 >> 2));
    puVar8 = (uint *)(this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  tVar9._4_4_ = 0;
  tVar9.trodes_timestamp = *puVar8;
  tVar9.system_timestamp = (this->super_HFSubConsumer).lasttimestamp;
  return tVar9;
}

Assistant:

timestamp_t NeuralConsumer::getData(int16_t *dest){
    readData(tempinput.data(), tempinput.size()*sizeof(int16_t));
    int16_t *src = tempinput.data() + sizeof(uint32_t)/sizeof(int16_t); //timestamp is first
    int offset = 0;
//     for(const auto &i : args.indices){
//         //i is the ith channel. so i*sizeof(int16_t) is the offset after the first one.
// //        memcpy(dst+offset, src + i*sizeof(int16_t), sizeof(int16_t));
//         dest[offset] = *(int16_t*)(src+i*sizeof(int16_t));
//         offset++;
//     }
    for(unsigned int i = 0; i < args.indices.size(); i+=2){
        std::copy(src+args.indices[i], src+args.indices[i]+args.indices[i+1], dest+offset);
        offset += args.indices[i+1];
    }
    return {*(uint32_t*)tempinput.data(), lastSysTimestamp()}; //Timestamp at beginning of packet
}